

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItemGroup::addToGroup(QGraphicsItemGroup *this,QGraphicsItem *item)

{
  double dVar1;
  qreal qVar2;
  QGraphicsItemPrivate *pQVar3;
  TransformData *pTVar4;
  QGraphicsTransform **ppQVar5;
  QGraphicsTransform *pQVar6;
  QGraphicsItemPrivate *pQVar7;
  long lVar8;
  qreal *pqVar9;
  qreal *pqVar10;
  QTransform *pQVar11;
  long lVar12;
  QArrayData *pQVar13;
  long in_FS_OFFSET;
  byte bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  QPointF QVar18;
  bool ok;
  QTransform itemTransform;
  double local_258;
  double local_248;
  QRectF local_228;
  QRectF local_208;
  QRectF local_1e8;
  bool local_1c1;
  QRectF local_1c0 [2];
  undefined4 local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined8 local_154;
  undefined8 uStack_14c;
  undefined4 local_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  QTransform local_128;
  QTransform local_d8;
  qreal local_88 [10];
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    addToGroup();
  }
  else if (item == &this->super_QGraphicsItem) {
    addToGroup();
  }
  else {
    pQVar3 = (this->super_QGraphicsItem).d_ptr.d;
    local_1c1 = true;
    pqVar9 = (qreal *)&DAT_006f1ed0;
    pqVar10 = local_88;
    for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
      *pqVar10 = *pqVar9;
      pqVar9 = pqVar9 + 1;
      pqVar10 = pqVar10 + 1;
    }
    QGraphicsItem::itemTransform((QTransform *)local_88,item,&this->super_QGraphicsItem,&local_1c1);
    if (local_1c1 == false) {
      addToGroup();
    }
    else {
      pqVar9 = local_88;
      pQVar11 = &local_d8;
      for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pQVar11->m_matrix[0][0] = *pqVar9;
        pqVar9 = pqVar9 + (ulong)bVar14 * -2 + 1;
        pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      local_128.m_matrix[0][0] = 0.0;
      local_128.m_matrix[0][1] = 0.0;
      QVar18 = QGraphicsItem::mapFromItem(&this->super_QGraphicsItem,item,(QPointF *)&local_128);
      local_128.m_matrix[0][0] = QVar18.xp;
      local_128.m_matrix[0][1] = QVar18.yp;
      QGraphicsItem::setPos(item,(QPointF *)&local_128);
      QGraphicsItem::setParentItem(item,&this->super_QGraphicsItem);
      pQVar7 = (item->d_ptr).d;
      dVar17 = (pQVar7->pos).xp;
      dVar1 = (pQVar7->pos).yp;
      if ((((dVar17 != 0.0) || (NAN(dVar17))) || (dVar1 != 0.0)) || (NAN(dVar1))) {
        QTransform::fromTranslate(-dVar17,-dVar1);
        QTransform::operator*=(&local_d8,&local_128);
        pQVar7 = (item->d_ptr).d;
      }
      pTVar4 = pQVar7->transformData;
      if (pTVar4 == (TransformData *)0x0) {
        local_248 = 0.0;
        local_258 = 0.0;
      }
      else {
        local_258 = pTVar4->xOrigin;
        local_248 = pTVar4->yOrigin;
      }
      local_16c = 0x3f800000;
      local_168 = 0;
      uStack_160 = 0;
      local_158 = 0x3f800000;
      local_154 = 0;
      uStack_14c = 0;
      local_144 = 0x3f800000;
      local_140 = 0;
      uStack_138 = 0;
      local_130 = 0x3f800000;
      if (pTVar4 == (TransformData *)0x0) {
        pQVar13 = (QArrayData *)0x0;
      }
      else {
        pQVar13 = &((pTVar4->graphicsTransforms).d.d)->super_QArrayData;
        ppQVar5 = (pTVar4->graphicsTransforms).d.ptr;
        lVar8 = (pTVar4->graphicsTransforms).d.size;
        if (pQVar13 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&pQVar13->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&pQVar13->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (lVar8 != 0) {
          lVar12 = 0;
          do {
            pQVar6 = ppQVar5[lVar12];
            (**(code **)(*(long *)pQVar6 + 0x60))(pQVar6,&local_16c);
            lVar12 = lVar12 + 1;
          } while (lVar8 != lVar12);
        }
      }
      QMatrix4x4::toTransform();
      QTransform::inverted((bool *)&local_128);
      QTransform::operator*=(&local_d8,&local_128);
      QTransform::translate(local_258,local_248);
      pTVar4 = ((item->d_ptr).d)->transformData;
      if (pTVar4 == (TransformData *)0x0) {
        uVar15 = 0;
        uVar16 = 0;
      }
      else {
        qVar2 = pTVar4->rotation;
        uVar15 = SUB84(qVar2,0);
        uVar16 = (undefined4)((ulong)qVar2 >> 0x20);
      }
      QTransform::rotate(-(double)CONCAT44(uVar16,uVar15),(Axis)&local_d8);
      pTVar4 = ((item->d_ptr).d)->transformData;
      dVar1 = 1.0;
      dVar17 = 1.0;
      if (pTVar4 != (TransformData *)0x0) {
        dVar17 = pTVar4->scale;
        dVar1 = 1.0 / dVar17;
      }
      QTransform::scale(dVar1,1.0 / dVar17);
      QTransform::translate(-local_258,-local_248);
      QGraphicsItem::setTransform(item,&local_d8,false);
      QGraphicsItemPrivate::setIsMemberOfGroup((item->d_ptr).d,true);
      QGraphicsItem::prepareGeometryChange(&this->super_QGraphicsItem);
      (*item->_vptr_QGraphicsItem[3])(&local_208,item);
      QGraphicsItem::childrenBoundingRect(&local_228,item);
      QRectF::operator|(&local_1e8,&local_208);
      QTransform::mapRect(local_1c0);
      QRectF::operator|((QRectF *)&local_128,(QRectF *)(pQVar3 + 1));
      pQVar3[1].extras.d.ptr = (ExtraStruct *)local_128.m_matrix[0][2];
      pQVar3[1].extras.d.size = (qsizetype)local_128.m_matrix[1][0];
      pQVar3[1]._vptr_QGraphicsItemPrivate = (_func_int **)local_128.m_matrix[0][0];
      pQVar3[1].extras.d.d = (Data *)local_128.m_matrix[0][1];
      local_128.m_matrix[0][2] = 0.0;
      local_128.m_matrix[1][0] = 0.0;
      local_128.m_matrix[0][0] = 0.0;
      local_128.m_matrix[0][1] = 0.0;
      QGraphicsItem::update(&this->super_QGraphicsItem,(QRectF *)&local_128);
      if (pQVar13 != (QArrayData *)0x0) {
        LOCK();
        (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar13,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemGroup::addToGroup(QGraphicsItem *item)
{
    Q_D(QGraphicsItemGroup);
    if (!item) {
        qWarning("QGraphicsItemGroup::addToGroup: cannot add null item");
        return;
    }
    if (item == this) {
        qWarning("QGraphicsItemGroup::addToGroup: cannot add a group to itself");
        return;
    }

    // COMBINE
    bool ok;
    QTransform itemTransform = item->itemTransform(this, &ok);

    if (!ok) {
        qWarning("QGraphicsItemGroup::addToGroup: could not find a valid transformation from item to group coordinates");
        return;
    }

    QTransform newItemTransform(itemTransform);
    item->setPos(mapFromItem(item, 0, 0));
    item->setParentItem(this);

    // removing position from translation component of the new transform
    if (!item->pos().isNull())
        newItemTransform *= QTransform::fromTranslate(-item->x(), -item->y());

    // removing additional transformations properties applied with itemTransform()
    QPointF origin = item->transformOriginPoint();
    QMatrix4x4 m;
    QList<QGraphicsTransform*> transformList = item->transformations();
    for (int i = 0; i < transformList.size(); ++i)
        transformList.at(i)->applyTo(&m);
    newItemTransform *= m.toTransform().inverted();
    newItemTransform.translate(origin.x(), origin.y());
    newItemTransform.rotate(-item->rotation());
    newItemTransform.scale(1/item->scale(), 1/item->scale());
    newItemTransform.translate(-origin.x(), -origin.y());

    // ### Expensive, we could maybe use dirtySceneTransform bit for optimization

    item->setTransform(newItemTransform);
    item->d_func()->setIsMemberOfGroup(true);
    prepareGeometryChange();
    d->itemsBoundingRect |= itemTransform.mapRect(item->boundingRect() | item->childrenBoundingRect());
    update();
}